

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFrame.cpp
# Opt level: O2

void __thiscall KDReports::Frame::build(Frame *this,ReportBuilder *builder)

{
  TextDocumentData *pTVar1;
  FramePrivate *pFVar2;
  ElementData *pEVar3;
  long lVar4;
  QTextCursor *pQVar5;
  long lVar6;
  qreal apadding;
  QTextFrameFormat format;
  QTextCursor contentsCursor;
  QColor local_b8;
  ReportBuilder contentsBuilder;
  
  QTextFrameFormat::QTextFrameFormat(&format);
  pFVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
           .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl;
  pTVar1 = (TextDocumentData *)pFVar2->m_width;
  if (((double)pTVar1 != 0.0) || (NAN((double)pTVar1))) {
    if (pFVar2->m_widthUnit == Millimeters) {
      contentsBuilder.m_contentDocument = (TextDocumentData *)mmToPixels((qreal)pTVar1);
      contentsBuilder._vptr_ReportBuilder._0_4_ = 1;
      QTextFrameFormat::setWidth(&format,(QTextLength *)&contentsBuilder);
    }
    else {
      contentsBuilder._vptr_ReportBuilder._0_4_ = 2;
      contentsBuilder.m_contentDocument = pTVar1;
      QTextFrameFormat::setWidth(&format,(QTextLength *)&contentsBuilder);
    }
  }
  pFVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
           .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl;
  pTVar1 = (TextDocumentData *)pFVar2->m_height;
  if (((double)pTVar1 != 0.0) || (NAN((double)pTVar1))) {
    if (pFVar2->m_heightUnit == Millimeters) {
      contentsBuilder.m_contentDocument = (TextDocumentData *)mmToPixels((qreal)pTVar1);
      contentsBuilder._vptr_ReportBuilder._0_4_ = 1;
      QTextFrameFormat::setHeight(&format,(QTextLength *)&contentsBuilder);
    }
    else {
      contentsBuilder._vptr_ReportBuilder._0_4_ = 2;
      contentsBuilder.m_contentDocument = pTVar1;
      QTextFrameFormat::setHeight(&format,(QTextLength *)&contentsBuilder);
    }
  }
  apadding = mmToPixels(((this->d)._M_t.
                         super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
                         .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl)->
                        m_padding);
  QTextFrameFormat::setPadding(&format,apadding);
  QTextFrameFormat::setBorder
            (&format,((this->d)._M_t.
                      super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
                      .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl)->
                     m_border);
  QTextFrameFormat::setPosition
            (&format,((this->d)._M_t.
                      super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
                      .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl)->
                     m_position);
  pQVar5 = ReportBuilder::cursor(builder);
  QTextCursor::insertFrame((QTextFrameFormat *)pQVar5);
  QTextFrame::firstCursorPosition();
  ReportBuilder::ReportBuilder
            (&contentsBuilder,builder->m_contentDocument,&contentsCursor,builder->m_report);
  ReportBuilder::copyStateFrom(&contentsBuilder,builder);
  pFVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
           .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl;
  pEVar3 = *(ElementData **)((long)&(pFVar2->m_elements).d + 8);
  lVar4 = *(qsizetype *)((long)&(pFVar2->m_elements).d + 0x10);
  for (lVar6 = 0; lVar4 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    switch((&pEVar3->field_0x8)[lVar6] & 7) {
    case 0:
      ReportBuilder::addInlineElement
                (&contentsBuilder,*(Element **)((long)&pEVar3->m_element + lVar6));
      break;
    case 1:
      local_b8.cspec = Invalid;
      local_b8.ct.argb.alpha = 0xffff;
      local_b8.ct._2_8_ = 0;
      ReportBuilder::addBlockElement
                (&contentsBuilder,*(Element **)((long)&pEVar3->m_element + lVar6),
                 *(AlignmentFlag *)((long)&pEVar3->field_2 + lVar6),&local_b8);
      break;
    case 2:
      ReportBuilder::addVariable(&contentsBuilder,*(VariableType *)((long)&pEVar3->field_2 + lVar6))
      ;
      break;
    case 3:
      ReportBuilder::addVerticalSpacing(&contentsBuilder,*(qreal *)((long)&pEVar3->field_2 + lVar6))
      ;
    }
  }
  QTextCursor::movePosition((MoveOperation)pQVar5,0xb,0);
  ReportBuilder::~ReportBuilder(&contentsBuilder);
  QTextCursor::~QTextCursor(&contentsCursor);
  QTextFormat::~QTextFormat((QTextFormat *)&format);
  return;
}

Assistant:

void KDReports::Frame::build(ReportBuilder &builder) const
{
    // prepare the frame
    QTextFrameFormat format;
    if (d->m_width) {
        if (d->m_widthUnit == Millimeters) {
            format.setWidth(QTextLength(QTextLength::FixedLength, mmToPixels(d->m_width)));
        } else {
            format.setWidth(QTextLength(QTextLength::PercentageLength, d->m_width));
        }
    }
    if (d->m_height) {
        if (d->m_heightUnit == Millimeters) {
            format.setHeight(QTextLength(QTextLength::FixedLength, mmToPixels(d->m_height)));
        } else {
            format.setHeight(QTextLength(QTextLength::PercentageLength, d->m_height));
        }
    }

    format.setPadding(mmToPixels(padding()));
    format.setBorder(d->m_border);
    // TODO borderBrush like in AbstractTableElement
    format.setPosition(static_cast<QTextFrameFormat::Position>(d->m_position)); // those enums have the same value

    QTextCursor &textDocCursor = builder.cursor();

    QTextFrame *frame = textDocCursor.insertFrame(format);

    QTextCursor contentsCursor = frame->firstCursorPosition();

    ReportBuilder contentsBuilder(builder.currentDocumentData(), contentsCursor, builder.report());
    contentsBuilder.copyStateFrom(builder);

    for (const KDReports::ElementData &ed : std::as_const(d->m_elements)) {
        switch (ed.m_type) {
        case KDReports::ElementData::Inline:
            contentsBuilder.addInlineElement(*ed.m_element);
            break;
        case KDReports::ElementData::Block:
            contentsBuilder.addBlockElement(*ed.m_element, ed.m_align);
            break;
        case KDReports::ElementData::Variable:
            contentsBuilder.addVariable(ed.m_variableType);
            break;
        case KDReports::ElementData::VerticalSpacing:
            contentsBuilder.addVerticalSpacing(ed.m_value);
            break;
        }
    }

    textDocCursor.movePosition(QTextCursor::End);
}